

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::ScaleBackInteriorSolution
          (Model *this,Vector *x,Vector *xl,Vector *xu,Vector *slack,Vector *y,Vector *zl,Vector *zu
          )

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  reference piVar4;
  double *pdVar5;
  valarray<double> *in_RCX;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  long in_RDI;
  valarray<double> *in_stack_00000008;
  valarray<double> *in_stack_00000010;
  Int j;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffa0
  ;
  valarray<double> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc0;
  
  sVar3 = std::valarray<double>::size((valarray<double> *)(in_RDI + 0x2a0));
  if (sVar3 != 0) {
    std::valarray<double>::operator*=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
    std::valarray<double>::operator*=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
    std::valarray<double>::operator*=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
    std::valarray<double>::operator/=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
    std::valarray<double>::operator/=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  }
  sVar3 = std::valarray<double>::size((valarray<double> *)(in_RDI + 0x2b0));
  if (sVar3 != 0) {
    std::valarray<double>::operator*=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
    std::valarray<double>::operator/=
              ((valarray<double> *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  }
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff98);
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xffffffffffffffc0);
    iVar1 = *piVar4;
    pdVar5 = std::valarray<double>::operator[](in_RSI,(long)iVar1);
    *pdVar5 = *pdVar5 * -1.0;
    pdVar5 = std::valarray<double>::operator[](in_RDX,(long)iVar1);
    in_stack_ffffffffffffff98 = (vector<int,_std::allocator<int>_> *)*pdVar5;
    pdVar5 = std::valarray<double>::operator[](in_RCX,(long)iVar1);
    *pdVar5 = (double)in_stack_ffffffffffffff98;
    pdVar5 = std::valarray<double>::operator[](in_RDX,(long)iVar1);
    *pdVar5 = INFINITY;
    pdVar5 = std::valarray<double>::operator[](in_stack_00000008,(long)iVar1);
    in_stack_ffffffffffffffa0 =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)*pdVar5;
    pdVar5 = std::valarray<double>::operator[](in_stack_00000010,(long)iVar1);
    *pdVar5 = (double)in_stack_ffffffffffffffa0;
    pdVar5 = std::valarray<double>::operator[](in_stack_00000008,(long)iVar1);
    *pdVar5 = 0.0;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void Model::ScaleBackInteriorSolution(Vector& x, Vector& xl, Vector& xu,
                                      Vector& slack, Vector& y, Vector& zl,
                                      Vector& zu) const {
    if (colscale_.size() > 0) {
        x *= colscale_;
        xl *= colscale_;
        xu *= colscale_;
        zl /= colscale_;
        zu /= colscale_;
    }
    if (rowscale_.size() > 0) {
        y *= rowscale_;
        slack /= rowscale_;
    }
    for (Int j : flipped_vars_) {
        assert(std::isfinite(xl[j]));
        assert(std::isinf(xu[j]));
        assert(zu[j] == 0.0);
        x[j] *= -1.0;
        xu[j] = xl[j];
        xl[j] = INFINITY;
        zu[j] = zl[j];
        zl[j] = 0.0;
    }
}